

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QByteArray>::~QArrayDataPointer(QArrayDataPointer<QByteArray> *this)

{
  Data *pDVar1;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      std::_Destroy_aux<false>::__destroy<QByteArray*>(this->ptr,this->ptr + this->size);
      QArrayData::deallocate(&this->d->super_QArrayData,0x18,0x10);
      return;
    }
  }
  return;
}

Assistant:

bool deref() noexcept { return !d || d->deref(); }